

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_scalar_function_info.cpp
# Opt level: O2

void __thiscall
duckdb::AddScalarFunctionOverloadInfo::AddScalarFunctionOverloadInfo
          (AddScalarFunctionOverloadInfo *this,AlterEntryData *data,
          unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
          *new_overloads_p)

{
  AlterEntryData local_80;
  
  AlterEntryData::AlterEntryData(&local_80,data);
  AlterScalarFunctionInfo::AlterScalarFunctionInfo
            (&this->super_AlterScalarFunctionInfo,ADD_FUNCTION_OVERLOADS,&local_80);
  AlterEntryData::~AlterEntryData(&local_80);
  (this->super_AlterScalarFunctionInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddScalarFunctionOverloadInfo_02792200;
  (this->new_overloads).
  super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl =
       (new_overloads_p->
       super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl;
  (new_overloads_p->
  super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl =
       (CreateScalarFunctionInfo *)0x0;
  (this->super_AlterScalarFunctionInfo).super_AlterInfo.allow_internal = true;
  return;
}

Assistant:

AddScalarFunctionOverloadInfo::AddScalarFunctionOverloadInfo(AlterEntryData data,
                                                             unique_ptr<CreateScalarFunctionInfo> new_overloads_p)
    : AlterScalarFunctionInfo(AlterScalarFunctionType::ADD_FUNCTION_OVERLOADS, std::move(data)),
      new_overloads(std::move(new_overloads_p)) {
	this->allow_internal = true;
}